

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockExpectedCall::setup(TEST_GROUP_CppUTestGroupMockExpectedCall *this)

{
  MockNamedValueComparatorsAndCopiersRepository *pMVar1;
  MockCheckedExpectedCall *pMVar2;
  SimpleString local_30 [2];
  TEST_GROUP_CppUTestGroupMockExpectedCall *local_10;
  TEST_GROUP_CppUTestGroupMockExpectedCall *this_local;
  
  local_10 = this;
  pMVar1 = MockNamedValue::getDefaultComparatorsAndCopiersRepository();
  this->originalComparatorRepository = pMVar1;
  pMVar2 = (MockCheckedExpectedCall *)
           operator_new(0xa0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                        ,0xa1);
  MockCheckedExpectedCall::MockCheckedExpectedCall(pMVar2,1);
  this->call = pMVar2;
  pMVar2 = this->call;
  SimpleString::SimpleString(local_30,"funcName");
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar2,local_30);
  SimpleString::~SimpleString(local_30);
  return;
}

Assistant:

void setup() _override
    {
        originalComparatorRepository = MockNamedValue::getDefaultComparatorsAndCopiersRepository();
        call = new MockCheckedExpectedCall(1);
        call->withName("funcName");
    }